

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O3

void __thiscall lsim::Simulator::release_node(Simulator *this,node_t node_id)

{
  iterator __position;
  uint local_4;
  
  if ((ulong)node_id <
      (ulong)((long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this->m_node_values_read).
                    super__Vector_base<lsim::Value,_std::allocator<lsim::Value>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2)) {
    __position._M_current =
         (this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
        .super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::_M_realloc_insert<unsigned_int_const&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&this->m_free_nodes,__position
                 ,&local_4);
    }
    else {
      *__position._M_current = node_id;
      (this->m_free_nodes).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    return;
  }
  __assert_fail("node_id < m_node_values_read.size()",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0xa7,"void lsim::Simulator::release_node(node_t)");
}

Assistant:

void Simulator::release_node(node_t node_id) {
    assert(node_id < m_node_values_read.size());
    m_free_nodes.push_back(node_id);
}